

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

void __thiscall
andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::Geometry
          (Geometry<std::allocator<unsigned_long>_> *this,
          Geometry<std::allocator<unsigned_long>_> *g)

{
  unsigned_long *local_40;
  Geometry<std::allocator<unsigned_long>_> *g_local;
  Geometry<std::allocator<unsigned_long>_> *this_local;
  
  std::allocator<unsigned_long>::allocator
            ((allocator<unsigned_long> *)this,(allocator<unsigned_long> *)g);
  if (g->dimension_ == 0) {
    local_40 = (unsigned_long *)0x0;
  }
  else {
    local_40 = __gnu_cxx::new_allocator<unsigned_long>::allocate
                         ((new_allocator<unsigned_long> *)this,g->dimension_ * 3,(void *)0x0);
  }
  this->shape_ = local_40;
  this->shapeStrides_ = this->shape_ + g->dimension_;
  this->strides_ = this->shapeStrides_ + g->dimension_;
  this->dimension_ = g->dimension_;
  this->size_ = g->size_;
  this->coordinateOrder_ = g->coordinateOrder_;
  this->isSimple_ = (bool)(g->isSimple_ & 1);
  memcpy(this->shape_,g->shape_,this->dimension_ * 0x18);
  return;
}

Assistant:

inline 
Geometry<A>::Geometry
(
    const Geometry<A>& g
)
: allocator_(g.allocator_),
  shape_(g.dimension_==0 ? 0 : allocator_.allocate(g.dimension_*3)), 
  shapeStrides_(shape_ + g.dimension_), 
  strides_(shapeStrides_ + g.dimension_), 
  dimension_(g.dimension_),
  size_(g.size_), 
  coordinateOrder_(g.coordinateOrder_), 
  isSimple_(g.isSimple_)
{
    /*
    for(std::size_t j=0; j<dimension_; ++j) {
        shape_[j] = g.shape_[j];
        shapeStrides_[j] = g.shapeStrides_[j];
        strides_[j] = g.strides_[j];
    }
    */
    memcpy(shape_, g.shape_, (dimension_*3)*sizeof(std::size_t));
}